

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall cmTarget::GetImplibGNUtoMS(cmTarget *this,string *gnuName,string *out,char *newExt)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  bVar1 = HasImplibGNUtoMS(this);
  if ((bVar1) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)gnuName);
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    bVar3 = iVar2 == 0;
    bVar1 = true;
  }
  else {
    bVar1 = false;
    bVar3 = false;
  }
  if ((bVar1) && (local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (bVar3 != false) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)gnuName);
    std::__cxx11::string::operator=((string *)out,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    std::__cxx11::string::append((char *)out);
  }
  return bVar3;
}

Assistant:

bool cmTarget::GetImplibGNUtoMS(std::string const& gnuName,
                                std::string& out, const char* newExt) const
{
  if(this->HasImplibGNUtoMS() &&
     gnuName.size() > 6 && gnuName.substr(gnuName.size()-6) == ".dll.a")
    {
    out = gnuName.substr(0, gnuName.size()-6);
    out += newExt? newExt : ".lib";
    return true;
    }
  return false;
}